

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathCompExprPtr xmlXPathTryStreamCompile(xmlXPathContextPtr ctxt,xmlChar *str)

{
  xmlNsPtr pxVar1;
  xmlChar *pxVar2;
  xmlPatternPtr comp_00;
  xmlXPathCompExprPtr pxVar3;
  int iVar4;
  xmlChar *tmp;
  int j;
  int i;
  xmlNsPtr ns;
  xmlChar **namespaces;
  xmlDictPtr dict;
  xmlXPathCompExprPtr comp;
  xmlPatternPtr stream;
  xmlChar *str_local;
  xmlXPathContextPtr ctxt_local;
  
  namespaces = (xmlChar **)0x0;
  ns = (xmlNsPtr)0x0;
  pxVar2 = xmlStrchr(str,'[');
  if (((pxVar2 == (xmlChar *)0x0) && (pxVar2 = xmlStrchr(str,'('), pxVar2 == (xmlChar *)0x0)) &&
     (pxVar2 = xmlStrchr(str,'@'), pxVar2 == (xmlChar *)0x0)) {
    pxVar2 = xmlStrchr(str,':');
    if ((pxVar2 != (xmlChar *)0x0) &&
       (((ctxt == (xmlXPathContextPtr)0x0 || (ctxt->nsNr == 0)) || (pxVar2[1] == ':')))) {
      return (xmlXPathCompExprPtr)0x0;
    }
    if ((ctxt != (xmlXPathContextPtr)0x0) && (namespaces = (xmlChar **)ctxt->dict, 0 < ctxt->nsNr))
    {
      ns = (xmlNsPtr)(*xmlMalloc)((long)((ctxt->nsNr + 1) * 2) << 3);
      if (ns == (xmlNsPtr)0x0) {
        xmlXPathErrMemory(ctxt,"allocating namespaces array\n");
        return (xmlXPathCompExprPtr)0x0;
      }
      tmp._4_4_ = 0;
      for (tmp._0_4_ = 0; (int)tmp < ctxt->nsNr; tmp._0_4_ = (int)tmp + 1) {
        pxVar1 = ctxt->namespaces[(int)tmp];
        iVar4 = tmp._4_4_ + 1;
        (&ns->next)[tmp._4_4_] = (_xmlNs *)pxVar1->href;
        tmp._4_4_ = tmp._4_4_ + 2;
        (&ns->next)[iVar4] = (_xmlNs *)pxVar1->prefix;
      }
      (&ns->next)[tmp._4_4_] = (_xmlNs *)0x0;
      (&ns->next)[tmp._4_4_ + 1] = (_xmlNs *)0x0;
    }
    comp_00 = xmlPatterncompile(str,(xmlDict *)namespaces,1,(xmlChar **)ns);
    if (ns != (xmlNsPtr)0x0) {
      (*xmlFree)(ns);
    }
    if ((comp_00 != (xmlPatternPtr)0x0) && (iVar4 = xmlPatternStreamable(comp_00), iVar4 == 1)) {
      pxVar3 = xmlXPathNewCompExpr();
      if (pxVar3 == (xmlXPathCompExprPtr)0x0) {
        xmlXPathErrMemory(ctxt,"allocating streamable expression\n");
        return (xmlXPathCompExprPtr)0x0;
      }
      pxVar3->stream = comp_00;
      pxVar3->dict = (xmlDictPtr)namespaces;
      if (pxVar3->dict == (xmlDictPtr)0x0) {
        return pxVar3;
      }
      xmlDictReference(pxVar3->dict);
      return pxVar3;
    }
    xmlFreePattern(comp_00);
  }
  return (xmlXPathCompExprPtr)0x0;
}

Assistant:

static xmlXPathCompExprPtr
xmlXPathTryStreamCompile(xmlXPathContextPtr ctxt, const xmlChar *str) {
    /*
     * Optimization: use streaming patterns when the XPath expression can
     * be compiled to a stream lookup
     */
    xmlPatternPtr stream;
    xmlXPathCompExprPtr comp;
    xmlDictPtr dict = NULL;
    const xmlChar **namespaces = NULL;
    xmlNsPtr ns;
    int i, j;

    if ((!xmlStrchr(str, '[')) && (!xmlStrchr(str, '(')) &&
        (!xmlStrchr(str, '@'))) {
	const xmlChar *tmp;

	/*
	 * We don't try to handle expressions using the verbose axis
	 * specifiers ("::"), just the simplified form at this point.
	 * Additionally, if there is no list of namespaces available and
	 *  there's a ":" in the expression, indicating a prefixed QName,
	 *  then we won't try to compile either. xmlPatterncompile() needs
	 *  to have a list of namespaces at compilation time in order to
	 *  compile prefixed name tests.
	 */
	tmp = xmlStrchr(str, ':');
	if ((tmp != NULL) &&
	    ((ctxt == NULL) || (ctxt->nsNr == 0) || (tmp[1] == ':')))
	    return(NULL);

	if (ctxt != NULL) {
	    dict = ctxt->dict;
	    if (ctxt->nsNr > 0) {
		namespaces = xmlMalloc(2 * (ctxt->nsNr + 1) * sizeof(xmlChar*));
		if (namespaces == NULL) {
		    xmlXPathErrMemory(ctxt, "allocating namespaces array\n");
		    return(NULL);
		}
		for (i = 0, j = 0; (j < ctxt->nsNr); j++) {
		    ns = ctxt->namespaces[j];
		    namespaces[i++] = ns->href;
		    namespaces[i++] = ns->prefix;
		}
		namespaces[i++] = NULL;
		namespaces[i] = NULL;
	    }
	}

	stream = xmlPatterncompile(str, dict, XML_PATTERN_XPATH, namespaces);
	if (namespaces != NULL) {
	    xmlFree((xmlChar **)namespaces);
	}
	if ((stream != NULL) && (xmlPatternStreamable(stream) == 1)) {
	    comp = xmlXPathNewCompExpr();
	    if (comp == NULL) {
		xmlXPathErrMemory(ctxt, "allocating streamable expression\n");
		return(NULL);
	    }
	    comp->stream = stream;
	    comp->dict = dict;
	    if (comp->dict)
		xmlDictReference(comp->dict);
	    return(comp);
	}
	xmlFreePattern(stream);
    }
    return(NULL);
}